

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void http_server_close(nni_http_server *s)

{
  nng_stream_listener *pnVar1;
  
  if (s->closed == false) {
    s->closed = true;
    nni_aio_close(&s->accaio);
    pnVar1 = s->listener;
    if (pnVar1 != (nng_stream_listener *)0x0) {
      if (pnVar1 != (nng_stream_listener *)0x0) {
        (*pnVar1->sl_close)(pnVar1);
        return;
      }
      return;
    }
  }
  return;
}

Assistant:

static void
http_server_close(nni_http_server *s)
{
	if (s->closed) {
		return;
	}
	s->closed = true;

	nni_aio_close(&s->accaio);

	// Close the TCP endpoint that is listening.
	if (s->listener) {
		nng_stream_listener_close(s->listener);
	}
}